

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinUtil.c
# Opt level: O3

void Min_CubeCreate(Vec_Str_t *vCover,Min_Cube_t *pCube,char Type)

{
  size_t sVar1;
  char *pcVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar15 [16];
  long lVar19;
  undefined1 in_XMM6 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  uVar6 = *(uint *)&pCube->field_0x8;
  uVar4 = uVar6 >> 10 & 0xfff;
  if (uVar4 == 0) {
    uVar11 = 0;
  }
  else {
    uVar7 = 0;
    uVar11 = 0;
    do {
      uVar9 = pCube->uData[uVar7] >> 1 ^ pCube->uData[uVar7];
      iVar12 = 0;
      iVar13 = 0;
      iVar14 = 0;
      iVar8 = 0x10;
      auVar15 = _DAT_0098d710;
      do {
        auVar20 = pshuflw(in_XMM6,auVar15,0xfe);
        lVar19 = auVar20._0_8_;
        auVar22._0_4_ = uVar9 >> lVar19;
        auVar22._4_4_ = uVar9 >> lVar19;
        auVar22._8_4_ = uVar9 >> lVar19;
        auVar22._12_4_ = uVar9 >> lVar19;
        auVar20 = pshuflw(auVar20,auVar15,0x54);
        iVar16 = auVar15._4_4_;
        iVar17 = auVar15._8_4_;
        iVar18 = auVar15._12_4_;
        auVar21._0_8_ = auVar15._8_8_;
        auVar21._8_4_ = iVar17;
        auVar21._12_4_ = iVar18;
        auVar23 = pshuflw(auVar22,auVar21,0xfe);
        in_XMM6 = pshuflw(auVar21,auVar21,0x54);
        uVar11 = uVar11 + (uVar9 >> auVar20._0_8_ & 1);
        iVar12 = iVar12 + (auVar22._4_4_ & 1);
        iVar13 = iVar13 + (uVar9 >> in_XMM6._0_8_ & 1);
        iVar14 = iVar14 + (uVar9 >> auVar23._0_8_ & 1);
        auVar15._0_4_ = auVar15._0_4_ + 8;
        auVar15._4_4_ = iVar16 + 8;
        auVar15._8_4_ = iVar17 + 8;
        auVar15._12_4_ = iVar18 + 8;
        iVar8 = iVar8 + -4;
      } while (iVar8 != 0);
      uVar11 = iVar14 + iVar12 + iVar13 + uVar11;
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar4);
  }
  if (uVar6 >> 0x16 != uVar11) {
    __assert_fail("(int)pCube->nLits == Min_CubeCountLits(pCube)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/cov/covMinUtil.c"
                  ,0x30,"void Min_CubeCreate(Vec_Str_t *, Min_Cube_t *, char)");
  }
  if ((uVar6 & 0x3ff) != 0) {
    bVar10 = 0;
    uVar6 = 0;
    do {
      uVar5 = 2 << (bVar10 & 0x1e);
      uVar4 = pCube->uData[uVar6 >> 4];
      uVar11 = vCover->nCap;
      uVar9 = vCover->nSize;
      uVar7 = (ulong)uVar9;
      if ((uVar4 >> (bVar10 & 0x1e) & 1) == 0) {
        if ((uVar4 & uVar5) == 0) {
          if (uVar9 == uVar11) {
            if ((int)uVar9 < 0x10) {
              if (vCover->pArray == (char *)0x0) {
                pcVar2 = (char *)malloc(0x10);
              }
              else {
                pcVar2 = (char *)realloc(vCover->pArray,0x10);
              }
              vCover->pArray = pcVar2;
              vCover->nCap = 0x10;
            }
            else {
              sVar1 = uVar7 * 2;
              if (vCover->pArray == (char *)0x0) {
                pcVar2 = (char *)malloc(sVar1);
              }
              else {
                pcVar2 = (char *)realloc(vCover->pArray,sVar1);
              }
              vCover->pArray = pcVar2;
              vCover->nCap = (int)sVar1;
            }
          }
          else {
            pcVar2 = vCover->pArray;
          }
          cVar3 = '?';
        }
        else {
          if (uVar9 == uVar11) {
            if ((int)uVar9 < 0x10) {
              if (vCover->pArray == (char *)0x0) {
                pcVar2 = (char *)malloc(0x10);
              }
              else {
                pcVar2 = (char *)realloc(vCover->pArray,0x10);
              }
              vCover->pArray = pcVar2;
              vCover->nCap = 0x10;
            }
            else {
              sVar1 = uVar7 * 2;
              if (vCover->pArray == (char *)0x0) {
                pcVar2 = (char *)malloc(sVar1);
              }
              else {
                pcVar2 = (char *)realloc(vCover->pArray,sVar1);
              }
              vCover->pArray = pcVar2;
              vCover->nCap = (int)sVar1;
            }
          }
          else {
            pcVar2 = vCover->pArray;
          }
          cVar3 = '1';
        }
      }
      else if ((uVar4 & uVar5) == 0) {
        if (uVar9 == uVar11) {
          if ((int)uVar9 < 0x10) {
            if (vCover->pArray == (char *)0x0) {
              pcVar2 = (char *)malloc(0x10);
            }
            else {
              pcVar2 = (char *)realloc(vCover->pArray,0x10);
            }
            vCover->pArray = pcVar2;
            vCover->nCap = 0x10;
          }
          else {
            sVar1 = uVar7 * 2;
            if (vCover->pArray == (char *)0x0) {
              pcVar2 = (char *)malloc(sVar1);
            }
            else {
              pcVar2 = (char *)realloc(vCover->pArray,sVar1);
            }
            vCover->pArray = pcVar2;
            vCover->nCap = (int)sVar1;
          }
        }
        else {
          pcVar2 = vCover->pArray;
        }
        cVar3 = '0';
      }
      else {
        if (uVar9 == uVar11) {
          if ((int)uVar9 < 0x10) {
            if (vCover->pArray == (char *)0x0) {
              pcVar2 = (char *)malloc(0x10);
            }
            else {
              pcVar2 = (char *)realloc(vCover->pArray,0x10);
            }
            vCover->pArray = pcVar2;
            vCover->nCap = 0x10;
          }
          else {
            sVar1 = uVar7 * 2;
            if (vCover->pArray == (char *)0x0) {
              pcVar2 = (char *)malloc(sVar1);
            }
            else {
              pcVar2 = (char *)realloc(vCover->pArray,sVar1);
            }
            vCover->pArray = pcVar2;
            vCover->nCap = (int)sVar1;
          }
        }
        else {
          pcVar2 = vCover->pArray;
        }
        cVar3 = '-';
      }
      iVar8 = vCover->nSize;
      vCover->nSize = iVar8 + 1;
      pcVar2[iVar8] = cVar3;
      uVar6 = uVar6 + 1;
      bVar10 = bVar10 + 2;
    } while (uVar6 < (*(uint *)&pCube->field_0x8 & 0x3ff));
  }
  uVar6 = vCover->nSize;
  if (uVar6 == vCover->nCap) {
    if ((int)uVar6 < 0x10) {
      if (vCover->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(vCover->pArray,0x10);
      }
      vCover->pArray = pcVar2;
      vCover->nCap = 0x10;
    }
    else {
      sVar1 = (ulong)uVar6 * 2;
      if (vCover->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(sVar1);
      }
      else {
        pcVar2 = (char *)realloc(vCover->pArray,sVar1);
      }
      vCover->pArray = pcVar2;
      vCover->nCap = (int)sVar1;
    }
  }
  else {
    pcVar2 = vCover->pArray;
  }
  iVar8 = vCover->nSize;
  vCover->nSize = iVar8 + 1;
  pcVar2[iVar8] = ' ';
  uVar6 = vCover->nSize;
  if (uVar6 == vCover->nCap) {
    if ((int)uVar6 < 0x10) {
      if (vCover->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(vCover->pArray,0x10);
      }
      vCover->pArray = pcVar2;
      vCover->nCap = 0x10;
    }
    else {
      sVar1 = (ulong)uVar6 * 2;
      if (vCover->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(sVar1);
      }
      else {
        pcVar2 = (char *)realloc(vCover->pArray,sVar1);
      }
      vCover->pArray = pcVar2;
      vCover->nCap = (int)sVar1;
    }
  }
  else {
    pcVar2 = vCover->pArray;
  }
  iVar8 = vCover->nSize;
  vCover->nSize = iVar8 + 1;
  pcVar2[iVar8] = Type;
  uVar6 = vCover->nSize;
  if (uVar6 == vCover->nCap) {
    if ((int)uVar6 < 0x10) {
      if (vCover->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(vCover->pArray,0x10);
      }
      vCover->pArray = pcVar2;
      vCover->nCap = 0x10;
    }
    else {
      sVar1 = (ulong)uVar6 * 2;
      if (vCover->pArray == (char *)0x0) {
        pcVar2 = (char *)malloc(sVar1);
      }
      else {
        pcVar2 = (char *)realloc(vCover->pArray,sVar1);
      }
      vCover->pArray = pcVar2;
      vCover->nCap = (int)sVar1;
    }
  }
  else {
    pcVar2 = vCover->pArray;
  }
  iVar8 = vCover->nSize;
  vCover->nSize = iVar8 + 1;
  pcVar2[iVar8] = '\n';
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Min_CubeCreate( Vec_Str_t * vCover, Min_Cube_t * pCube, char Type )
{
    int i;
    assert( (int)pCube->nLits == Min_CubeCountLits(pCube) );
    for ( i = 0; i < (int)pCube->nVars; i++ )
        if ( Min_CubeHasBit(pCube, i*2) )
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
//                fprintf( pFile, "-" );
                Vec_StrPush( vCover, '-' );
            else
//                fprintf( pFile, "0" );
                Vec_StrPush( vCover, '0' );
        }
        else
        {
            if ( Min_CubeHasBit(pCube, i*2+1) )
 //               fprintf( pFile, "1" );
                Vec_StrPush( vCover, '1' );
            else
//                fprintf( pFile, "?" );
                Vec_StrPush( vCover, '?' );
        }
//    fprintf( pFile, " 1\n" );
    Vec_StrPush( vCover, ' ' );
    Vec_StrPush( vCover, Type );
    Vec_StrPush( vCover, '\n' );
}